

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_runtime_symtab_from_macr(CVmImageLoader *this,ulong siz)

{
  undefined2 uVar1;
  int iVar2;
  CVmRuntimeSymbols *pCVar3;
  undefined4 extraout_var;
  vm_runtime_sym *pvVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  size_t arglen;
  uint uVar8;
  bool bVar9;
  char buf [10];
  ulong siz_local;
  uint local_ac;
  ulong local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong local_90;
  char sym [80];
  
  siz_local = siz;
  if (this->runtime_macros_ == (CVmRuntimeSymbols *)0x0) {
    pCVar3 = (CVmRuntimeSymbols *)operator_new(0x18);
    pCVar3->head_ = (vm_runtime_sym *)0x0;
    pCVar3->tail_ = (vm_runtime_sym *)0x0;
    pCVar3->cnt_ = 0;
    this->runtime_macros_ = pCVar3;
  }
  read_data(this,buf,4,&siz_local);
  local_90 = (ulong)(uint)buf._0_4_;
  while (bVar9 = local_90 != 0, local_90 = local_90 - 1, bVar9) {
    read_data(this,buf,2,&siz_local);
    uVar5 = (ulong)(ushort)buf._0_2_;
    if (uVar5 < 0x51) {
      read_data(this,sym,uVar5,&siz_local);
    }
    else {
      skip_data(this,uVar5,&siz_local);
    }
    read_data(this,buf,4,&siz_local);
    local_ac = buf._0_4_ & 0xffff;
    uVar1 = buf._2_2_;
    uVar8 = (uint)(ushort)buf._2_2_;
    iVar2 = (*this->fp_->_vptr_CVmImageFile[8])();
    local_a0 = CONCAT44(extraout_var,iVar2);
    local_a8 = siz_local;
    arglen = 0;
    uVar6 = uVar8;
    while( true ) {
      bVar9 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar9) break;
      read_data(this,buf,2,&siz_local);
      arglen = arglen + (ushort)buf._0_2_ + 1;
      skip_data(this,(ulong)(ushort)buf._0_2_,&siz_local);
    }
    read_data(this,buf,4,&siz_local);
    local_98 = (ulong)(uint)buf._0_4_;
    pvVar4 = CVmRuntimeSymbols::add_macro
                       (this->runtime_macros_,sym,uVar5,local_98,local_ac,(uint)(ushort)uVar1,arglen
                       );
    (*this->fp_->_vptr_CVmImageFile[7])(this->fp_,local_a0);
    siz_local = local_a8;
    for (lVar7 = 1; lVar7 - (ulong)uVar8 != 1; lVar7 = lVar7 + 1) {
      read_data(this,buf,2,&siz_local);
      uVar5 = (ulong)(ushort)buf._0_2_;
      read_data(this,pvVar4->macro_args[lVar7 + -1],uVar5,&siz_local);
      pvVar4->macro_args[lVar7 + -1][uVar5] = '\0';
      if (lVar7 < pvVar4->macro_argc) {
        pvVar4->macro_args[lVar7] = pvVar4->macro_args[lVar7 + -1] + uVar5 + 1;
      }
    }
    skip_data(this,4,&siz_local);
    read_data(this,pvVar4->macro_expansion,local_98,&siz_local);
  }
  return;
}

Assistant:

void CVmImageLoader::load_runtime_symtab_from_macr(VMG_ ulong siz)
{
    const size_t TOK_SYM_MAX_LEN = 80;
    char buf[10];
    char sym[TOK_SYM_MAX_LEN];
    ulong cnt;

    /* allocate the macro table if we haven't already done so */
    if (runtime_macros_ == 0)
        runtime_macros_ = new CVmRuntimeSymbols();

    /* read the symbol count */
    read_data(buf, 4, &siz);
    cnt = t3rp4u(buf);

    /* read the symbols and populate the symbol table */
    for ( ; cnt != 0 ; --cnt)
    {
        size_t sym_len;
        size_t exp_len;
        int argc;
        unsigned int flags;
        int i;

        /* read the symbol's length */
        read_data(buf, 2, &siz);
        sym_len = osrp2(buf);

        /* if it fits, read it */
        if (sym_len <= TOK_SYM_MAX_LEN)
        {
            /* read the name */
            read_data(sym, sym_len, &siz);
        }
        else
        {
            /* it's too long - skip it */
            skip_data(sym_len, &siz);
        }

        /* read the flags and argument count */
        read_data(buf, 4, &siz);
        flags = osrp2(buf);
        argc = osrp2(buf + 2);

        /* remember the current position */
        long start_pos = fp_->get_seek();
        ulong start_siz = siz;

        /* count up the argument sizes */
        size_t arg_len = 0;
        for (i = 0 ; i < argc ; ++i)
        {
            /* read this argument length */
            read_data(buf, 2, &siz);
            size_t l = osrp2(buf);

            /* add it to the total, plus a null byte */
            arg_len += l + 1;

            /* skip it in the file */
            skip_data(l, &siz);
        }

        /* read the expansion size */
        read_data(buf, 4, &siz);
        exp_len = osrp4(buf);

        /* allocate the symbol entry */
        vm_runtime_sym *entry = runtime_macros_->add_macro(
            sym, sym_len, exp_len, flags, argc, arg_len);

        /* seek back to the start of the argument list */
        fp_->seek(start_pos);
        siz = start_siz;

        /* read the arguments */
        for (i = 0 ; i < argc ; ++i)
        {
            /* read the argument length */
            read_data(buf, 2, &siz);
            size_t l = osrp2(buf);

            /* read this argument, and null-terminate it */
            read_data(entry->macro_args[i], l, &siz);
            entry->macro_args[i][l] = '\0';

            /* commit the storage */
            entry->commit_macro_arg(i, l + 1);
        }

        /* read the expansion */
        skip_data(4, &siz);
        read_data(entry->macro_expansion, exp_len, &siz);
    }
}